

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O0

void __thiscall gui::TextBox::handleMouseRelease(TextBox *this,Button button,Vector2f *mouseParent)

{
  Vector2<float> *in_RDX;
  Button in_ESI;
  Widget *in_RDI;
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd0;
  Widget *funcArgs;
  
  funcArgs = in_RDI;
  Widget::toLocalOriginSpace(in_RDI,(Vector2f *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            (unaff_retaddr,funcArgs,in_ESI,in_RDX);
  Widget::handleMouseRelease(in_RDI,in_ESI,in_RDX);
  return;
}

Assistant:

void TextBox::handleMouseRelease(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    onMouseRelease.emit(this, button, toLocalOriginSpace(mouseParent));
    baseClass::handleMouseRelease(button, mouseParent);
}